

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

Saig_MvObj_t * Saig_ManCreateReducedAig(Aig_Man_t *p,Vec_Ptr_t **pvFlops)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Saig_MvObj_t *pSVar4;
  Aig_Obj_t *pAVar5;
  Saig_MvObj_t *Entry;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Saig_MvObj_t *pEntry;
  Saig_MvObj_t *pAig;
  Vec_Ptr_t **pvFlops_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  pVVar3 = Vec_PtrAlloc(iVar1);
  *pvFlops = pVVar3;
  iVar1 = Aig_ManObjNumMax(p);
  pSVar4 = (Saig_MvObj_t *)calloc((long)(iVar1 + 1),0xc);
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_34) {
      iVar1 = Aig_ManObjNumMax(p);
      *(uint *)&pSVar4[iVar1].field_0x8 = *(uint *)&pSVar4[iVar1].field_0x8 & 0xfffffff8 | 7;
      return pSVar4;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      Entry = pSVar4 + local_34;
      *(uint *)&Entry->field_0x8 =
           *(uint *)&Entry->field_0x8 & 0xfffffff8 | (uint)*(undefined8 *)&pAVar5->field_0x18 & 7;
      iVar1 = Aig_ObjIsCi(pAVar5);
      if ((iVar1 == 0) && (local_34 != 0)) {
        iVar1 = Aig_ObjFaninId0(pAVar5);
        uVar2 = Aig_ObjFaninC0(pAVar5);
        Entry->iFan0 = iVar1 << 1 | uVar2;
        iVar1 = Aig_ObjIsCo(pAVar5);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsNode(pAVar5);
          if (iVar1 == 0) {
            __assert_fail("Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigSimMv.c"
                          ,0x9a,"Saig_MvObj_t *Saig_ManCreateReducedAig(Aig_Man_t *, Vec_Ptr_t **)")
            ;
          }
          iVar1 = Aig_ObjFaninId1(pAVar5);
          uVar2 = Aig_ObjFaninC1(pAVar5);
          Entry->iFan1 = iVar1 << 1 | uVar2;
        }
      }
      else {
        iVar1 = Saig_ObjIsLo(p,pAVar5);
        if (iVar1 != 0) {
          pAVar5 = Saig_ObjLoToLi(p,pAVar5);
          Entry->iFan0 = pAVar5->Id << 1;
          Entry->iFan1 = -1;
          Vec_PtrPush(*pvFlops,Entry);
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Saig_MvObj_t * Saig_ManCreateReducedAig( Aig_Man_t * p, Vec_Ptr_t ** pvFlops )
{
    Saig_MvObj_t * pAig, * pEntry;
    Aig_Obj_t * pObj;
    int i;
    *pvFlops = Vec_PtrAlloc( Aig_ManRegNum(p) );
    pAig = ABC_CALLOC( Saig_MvObj_t, Aig_ManObjNumMax(p)+1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        pEntry = pAig + i;
        pEntry->Type = pObj->Type;
        if ( Aig_ObjIsCi(pObj) || i == 0 )
        {
            if ( Saig_ObjIsLo(p, pObj) )
            {
                pEntry->iFan0 = (Saig_ObjLoToLi(p, pObj)->Id << 1);
                pEntry->iFan1 = -1;
                Vec_PtrPush( *pvFlops, pEntry );
            }
            continue;
        }
        pEntry->iFan0 = (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj);
        if ( Aig_ObjIsCo(pObj) )
            continue;
        assert( Aig_ObjIsNode(pObj) );
        pEntry->iFan1 = (Aig_ObjFaninId1(pObj) << 1) | Aig_ObjFaninC1(pObj);
    }
    pEntry = pAig + Aig_ManObjNumMax(p);
    pEntry->Type = AIG_OBJ_VOID;
    return pAig;
}